

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O1

function<chaiscript::Boxed_Value_()> *
chaiscript::dispatch::detail::build_function_caller_helper<chaiscript::Boxed_Value>
          (function<chaiscript::Boxed_Value_()> *__return_storage_ptr__,_func_Boxed_Value *param_1,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Type_Conversions_State *t_conversions)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  undefined8 *puVar4;
  Type_Conversions *pTVar5;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_68;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_48;
  Type_Conversions *local_30;
  
  Catch::clara::std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_68,funcs);
  psVar3 = local_68.
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar2 = local_68.
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar1 = local_68.
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (t_conversions == (Type_Conversions_State *)0x0) {
    pTVar5 = (Type_Conversions *)0x0;
  }
  else {
    pTVar5 = (t_conversions->m_conversions)._M_data;
  }
  local_48.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  local_30 = pTVar5;
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = psVar1;
  puVar4[1] = psVar2;
  puVar4[2] = psVar3;
  local_48.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4[3] = pTVar5;
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar4;
  __return_storage_ptr__->_M_invoker =
       Catch::clara::std::
       _Function_handler<chaiscript::Boxed_Value_(),_chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>_>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       Catch::clara::std::
       _Function_handler<chaiscript::Boxed_Value_(),_chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>_>
       ::_M_manager;
  Catch::clara::std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_48);
  Catch::clara::std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::function<Ret(Params...)>
  build_function_caller_helper(Ret(Params...), const std::vector<Const_Proxy_Function> &funcs, const Type_Conversions_State *t_conversions) {
    /*
    if (funcs.size() == 1)
    {
      std::shared_ptr<const Proxy_Function_Impl<Ret (Params...)>> pfi =
        std::dynamic_pointer_cast<const Proxy_Function_Impl<Ret (Params...)> >
          (funcs[0]);

      if (pfi)
      {
        return pfi->internal_function();
      }
      // looks like this either wasn't a Proxy_Function_Impl or the types didn't match
      // we cannot make any other guesses or assumptions really, so continuing
    }
  */

    return std::function<Ret(Params...)>(Build_Function_Caller_Helper<Ret, Params...>(funcs, t_conversions ? t_conversions->get() : nullptr));
  }